

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiTable *table;
  ImGuiListClipperData *pIVar3;
  ImGuiContext *pIVar4;
  int new_size;
  ImGuiListClipperData *this_00;
  ImGuiListClipperData local_48;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((GImGui->DebugLogFlags & 0x10) != 0) {
    ImGui::DebugLog("Clipper: Begin(%d,%.2f) in \'%s\'\n",SUB84((double)items_height,0),items_count,
                    pIVar2->Name);
  }
  table = pIVar4->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  this->StartPosY = (pIVar2->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = items_count;
  this->DisplayStart = -1;
  this->DisplayEnd = 0;
  iVar1 = pIVar4->ClipperTempDataStacked;
  new_size = iVar1 + 1;
  pIVar4->ClipperTempDataStacked = new_size;
  if ((pIVar4->ClipperTempData).Size <= iVar1) {
    local_48.ItemsFrozen = 0;
    local_48._20_4_ = 0;
    local_48.Ranges.Size = 0;
    local_48.Ranges.Capacity = 0;
    local_48.ListClipper = (ImGuiListClipper *)0x0;
    local_48.LossynessOffset = 0.0;
    local_48.StepNo = 0;
    local_48.Ranges.Data = (ImGuiListClipperRange *)0x0;
    ImVector<ImGuiListClipperData>::resize(&pIVar4->ClipperTempData,new_size,&local_48);
    ImVector<ImGuiListClipperRange>::~ImVector(&local_48.Ranges);
    new_size = pIVar4->ClipperTempDataStacked;
  }
  pIVar3 = (pIVar4->ClipperTempData).Data;
  this_00 = pIVar3 + (long)new_size + -1;
  ImGuiListClipperData::Reset(this_00,this);
  pIVar3[(long)new_size + -1].LossynessOffset = (pIVar2->DC).CursorStartPosLossyness.y;
  this->TempData = this_00;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IMGUI_DEBUG_LOG_CLIPPER("Clipper: Begin(%d,%.2f) in '%s'\n", items_count, items_height, window->Name);

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    DisplayStart = -1;
    DisplayEnd = 0;

    // Acquire temporary buffer
    if (++g.ClipperTempDataStacked > g.ClipperTempData.Size)
        g.ClipperTempData.resize(g.ClipperTempDataStacked, ImGuiListClipperData());
    ImGuiListClipperData* data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
    data->Reset(this);
    data->LossynessOffset = window->DC.CursorStartPosLossyness.y;
    TempData = data;
}